

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise1D::ConvolutionDepthWise1D(ConvolutionDepthWise1D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff70;
  
  Layer::Layer(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__ConvolutionDepthWise1D_02020ac0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  in_RDI[0x24] = 0;
  *(undefined4 *)(in_RDI + 0x25) = 0;
  *(undefined4 *)((long)in_RDI + 300) = 0;
  *(undefined4 *)(in_RDI + 0x26) = 0;
  *(undefined4 *)((long)in_RDI + 0x134) = 0;
  *(undefined4 *)(in_RDI + 0x27) = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  in_RDI[0x2e] = 0;
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  *(undefined4 *)((long)in_RDI + 0x17c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)((long)in_RDI + 0x184) = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  in_RDI[0x37] = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c4) = 0;
  *(undefined4 *)(in_RDI + 0x39) = 0;
  *(undefined4 *)((long)in_RDI + 0x1cc) = 0;
  *(undefined4 *)(in_RDI + 0x3a) = 0;
  in_RDI[0x3b] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

ConvolutionDepthWise1D::ConvolutionDepthWise1D()
{
    one_blob_only = true;
    support_inplace = false;
}